

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

size_t get_type_size(Type *type)

{
  size_t sVar1;
  size_t sStack_8;
  
  sVar1 = 0;
  switch(type->specifier) {
  case TS_CHAR:
    sStack_8 = 1;
    break;
  case TS_INT:
  case TS_FLOAT:
  case TS_ENUM:
  case TS_POINTER:
    sStack_8 = 4;
    break;
  case TS_DOUBLE:
    sStack_8 = 8;
    break;
  case TS_STRUCT:
  case TS_UNION:
    return *(size_t *)(*(long *)(type + 1) + 0x10);
  case TS_ARRAY:
  case TS_BITFIELD:
    sVar1 = *(size_t *)(type + 1);
  default:
    return sVar1;
  }
  return sStack_8;
}

Assistant:

size_t get_type_size(struct Type *type)
{
	switch(type->specifier)
	{
		case TS_VOID:
			return 0;
		case TS_CHAR:
			return 1;
		case TS_INT:
			return INT_SIZE;
		case TS_FLOAT:
			return FLOAT_SIZE;
		case TS_DOUBLE:
			return FLOAT_SIZE*2;
		case TS_STRUCT:
			return ((struct Type_Struct_Union*)type)->struct_union->size;
		case TS_ENUM:
			return INT_SIZE;
		case TS_UNION:
			return ((struct Type_Struct_Union*)type)->struct_union->size;
		case TS_POINTER:
			return PTR_SIZE;
		case TS_ARRAY:
			return ((struct Type_Array*)type)->size;
		case TS_FUNC:
			return 0;
		case TS_BITFIELD:
			return ((struct Type_Bit_Field*)type)->number_of_bits;
		case TS_NONE:
			return 0;
		case TS_ERROR:
			return 0;

	}	
}